

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

char * __thiscall XMLParser::XMLNode::getAttribute(XMLNode *this,char *name,int j)

{
  int local_28;
  int local_24;
  int i;
  int j_local;
  char *name_local;
  XMLNode *this_local;
  
  if (this->d == (XMLNodeData *)0x0) {
    this_local = (XMLNode *)0x0;
  }
  else {
    local_28 = 0;
    local_24 = j;
    _i = name;
    name_local = (char *)this;
    while (0 < local_24) {
      local_24 = local_24 + -1;
      getAttribute(this,_i,&local_28);
    }
    local_24 = local_24 + -1;
    this_local = (XMLNode *)getAttribute(this,_i,&local_28);
  }
  return (char *)this_local;
}

Assistant:

XMLCSTR XMLNode::getAttribute(XMLCSTR name, int j) const
    {
        if(!d)
            return NULL;
        int i = 0;
        while(j-- > 0)
            getAttribute(name, &i);
        return getAttribute(name, &i);
    }